

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesNH55
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ushort uVar5;
  short sVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  size_t sVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  uint8_t uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  size_t sVar33;
  long lVar34;
  ulong uVar35;
  bool bVar36;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_100;
  size_t *local_f8;
  ulong local_f0;
  int local_d4;
  ulong auStack_58 [5];
  
  uVar10 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  uVar3 = (position - 7) + num_bytes;
  sVar17 = position;
  if (7 < num_bytes) {
    sVar17 = uVar3;
  }
  lVar18 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar18 = 0x40;
  }
  uVar1 = position + num_bytes;
  lVar2 = position - 1;
  lVar4 = *(long *)(literal_context_lut + 0x10);
  local_130 = *(ulong *)dist_cache;
  uVar15 = lVar18 + position;
  uVar24 = (uint)ringbuffer_mask;
  local_f8 = last_insert_len;
  do {
LAB_0011b3f7:
    uVar29 = position;
    if (uVar1 <= uVar29 + 8) {
      *(ulong *)dist_cache = (local_130 + uVar1) - uVar29;
      *(long *)commands = *(long *)commands + ((long)local_f8 - (long)last_insert_len >> 4);
      return;
    }
    local_120 = uVar1 - uVar29;
    uVar12 = uVar10;
    if (uVar29 < uVar10) {
      uVar12 = uVar29;
    }
    uVar19 = uVar29 & ringbuffer_mask;
    uVar27 = ringbuffer[uVar19];
    local_100 = (ulong)*(int *)&(hasher->common).extra;
    if ((uVar29 - local_100 < uVar29) &&
       (uVar31 = (ulong)((uint)(uVar29 - local_100) & uVar24), uVar27 == ringbuffer[uVar31])) {
      uVar30 = local_120 & 0xfffffffffffffff8;
      uVar32 = 0;
      lVar11 = 0;
LAB_0011b47c:
      if (local_120 >> 3 == uVar32) {
        uVar26 = (ulong)((uint)local_120 & 7);
        for (; (bVar36 = uVar26 != 0, uVar26 = uVar26 - 1, uVar32 = local_120, bVar36 &&
               (uVar32 = uVar30, ringbuffer[uVar30 + uVar31] == ringbuffer[uVar30 + uVar19]));
            uVar30 = uVar30 + 1) {
        }
      }
      else {
        if (*(ulong *)(ringbuffer + uVar32 * 8 + uVar19) ==
            *(ulong *)(ringbuffer + uVar32 * 8 + uVar31)) break;
        uVar30 = *(ulong *)(ringbuffer + uVar32 * 8 + uVar31) ^
                 *(ulong *)(ringbuffer + uVar32 * 8 + uVar19);
        uVar31 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
          }
        }
        uVar32 = (uVar31 >> 3 & 0x1fffffff) - lVar11;
      }
      if ((uVar32 < 4) || (local_138 = uVar32 * 0x87 + 0x78f, local_138 < 0x7e5)) goto LAB_0011b4aa;
      uVar27 = ringbuffer[uVar32 + uVar19];
    }
    else {
LAB_0011b4aa:
      local_138 = 0x7e4;
      local_100 = 0;
      uVar32 = 0;
    }
    lVar11 = *(long *)&(params->hasher).num_last_distances_to_check;
    lVar34 = *(long *)(ringbuffer + uVar19);
    for (lVar20 = 0; lVar20 != 0x20; lVar20 = lVar20 + 8) {
      *(ulong *)((long)auStack_58 + lVar20) =
           (ulong)((uint)((ulong)(lVar34 * 0x35a7bd1e35a7bd00) >> 0x2c) + (int)lVar20 & 0xfffff);
    }
    uVar8 = (uint)uVar29;
    uVar31 = (ulong)((uint)local_120 & 7);
    for (lVar34 = 0; lVar34 != 4; lVar34 = lVar34 + 1) {
      uVar9 = *(uint *)(lVar11 + auStack_58[lVar34] * 4);
      uVar7 = uVar24 & uVar9;
      if (((uVar27 == ringbuffer[uVar32 + uVar7]) && (uVar29 != uVar9)) &&
         (uVar30 = uVar29 - uVar9, uVar30 <= uVar12)) {
        uVar26 = 0;
        lVar20 = 0;
LAB_0011b56c:
        uVar21 = local_120 & 0xfffffffffffffff8;
        uVar13 = uVar31;
        if (local_120 >> 3 == uVar26) {
          for (; (uVar26 = local_120, uVar13 != 0 &&
                 (uVar26 = uVar21, ringbuffer[uVar21 + uVar7] == ringbuffer[uVar21 + uVar19]));
              uVar21 = uVar21 + 1) {
            uVar13 = uVar13 - 1;
          }
        }
        else {
          if (*(ulong *)(ringbuffer + uVar26 * 8 + uVar19) ==
              *(ulong *)(ringbuffer + uVar26 * 8 + (ulong)uVar7)) goto code_r0x0011b57f;
          uVar21 = *(ulong *)(ringbuffer + uVar26 * 8 + (ulong)uVar7) ^
                   *(ulong *)(ringbuffer + uVar26 * 8 + uVar19);
          uVar26 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
            }
          }
          uVar26 = (uVar26 >> 3 & 0x1fffffff) - lVar20;
        }
        if (3 < uVar26) {
          iVar25 = 0x1f;
          if ((uint)uVar30 != 0) {
            for (; (uint)uVar30 >> iVar25 == 0; iVar25 = iVar25 + -1) {
            }
          }
          uVar21 = (ulong)(iVar25 * -0x1e + 0x780) + uVar26 * 0x87;
          if (local_138 < uVar21) {
            uVar27 = ringbuffer[uVar26 + uVar19];
            uVar32 = uVar26;
            local_138 = uVar21;
            local_100 = uVar30;
          }
        }
      }
    }
    *(uint *)(lVar11 + *(long *)((long)auStack_58 + (ulong)(uVar8 & 0x18)) * 4) = uVar8;
    if (0x1f < local_120 && (uVar29 & 3) == 0) {
      for (sVar33 = (params->dist).max_distance; sVar33 <= uVar29; sVar33 = sVar33 + 4) {
        uVar9 = (params->dist).distance_postfix_bits;
        uVar7 = uVar9 & 0x3fffffff;
        (params->dist).distance_postfix_bits =
             uVar9 * *(int *)((long)&(params->dictionary).words + 4) +
             (uint)ringbuffer[sVar33 + 0x20 & ringbuffer_mask] +
             ~(uint)ringbuffer[sVar33 & ringbuffer_mask] * (params->dictionary).num_transforms + 1;
        if (uVar7 < 0x1000000) {
          lVar34 = *(long *)&(params->dist).alphabet_size_max;
          uVar9 = *(uint *)(lVar34 + (ulong)uVar7 * 4);
          *(int *)(lVar34 + (ulong)uVar7 * 4) = (int)sVar33;
          if ((sVar33 == uVar29) && (uVar9 != 0xffffffff)) {
            uVar7 = uVar8 - uVar9;
            if (uVar7 <= uVar12) {
              uVar30 = 0;
              lVar34 = 0;
LAB_0011b6a2:
              uVar26 = local_120 & 0xfffffffffffffff8;
              uVar21 = uVar31;
              if (local_120 >> 3 == uVar30) {
                for (; (uVar30 = local_120, uVar21 != 0 &&
                       (uVar30 = uVar26,
                       ringbuffer[uVar26 + (uVar9 & uVar24)] == ringbuffer[uVar26 + uVar19]));
                    uVar26 = uVar26 + 1) {
                  uVar21 = uVar21 - 1;
                }
              }
              else {
                if (*(ulong *)(ringbuffer + uVar30 * 8 + uVar19) ==
                    *(ulong *)(ringbuffer + uVar30 * 8 + (ulong)(uVar9 & uVar24)))
                goto code_r0x0011b6b5;
                uVar26 = *(ulong *)(ringbuffer + uVar30 * 8 + (ulong)(uVar9 & uVar24)) ^
                         *(ulong *)(ringbuffer + uVar30 * 8 + uVar19);
                uVar30 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                uVar30 = (uVar30 >> 3 & 0x1fffffff) - lVar34;
              }
              if ((3 < uVar30) && (uVar32 < uVar30)) {
                iVar25 = 0x1f;
                if (uVar7 != 0) {
                  for (; uVar7 >> iVar25 == 0; iVar25 = iVar25 + -1) {
                  }
                }
                uVar26 = (ulong)(iVar25 * -0x1e + 0x780) + uVar30 * 0x87;
                if (local_138 < uVar26) {
                  uVar32 = uVar30;
                  local_138 = uVar26;
                  local_100 = (ulong)uVar7;
                }
              }
            }
          }
        }
      }
      (params->dist).max_distance = uVar29 + 4;
    }
    if (local_138 < 0x7e5) {
      local_130 = local_130 + 1;
      position = uVar29 + 1;
      if ((num_literals == (size_t *)0x0) && (uVar15 < position)) {
        if (uVar15 + (uint)((int)lVar18 * 4) < position) {
          uVar12 = uVar29 + 0x11;
          if (uVar3 <= uVar29 + 0x11) {
            uVar12 = uVar3;
          }
          for (; position < uVar12; position = position + 4) {
            *(uint *)(lVar11 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                               (position & ringbuffer_mask)) *
                                                     0x35a7bd1e35a7bd00) >> 0x2c) +
                                       ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
            local_130 = local_130 + 4;
          }
        }
        else {
          uVar12 = uVar29 + 9;
          if (uVar3 <= uVar29 + 9) {
            uVar12 = uVar3;
          }
          for (; position < uVar12; position = position + 2) {
            *(uint *)(lVar11 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                               (position & ringbuffer_mask)) *
                                                     0x35a7bd1e35a7bd00) >> 0x2c) +
                                       ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
            local_130 = local_130 + 2;
          }
        }
      }
      goto LAB_0011b3f7;
    }
    uVar12 = (ulong)*(int *)&(hasher->common).extra;
    uVar15 = local_130 + 4;
    uVar19 = (lVar2 + num_bytes) - uVar29;
    local_d4 = 0;
    do {
      uVar26 = (ulong)((uint)uVar19 & 7);
      uVar30 = uVar19 >> 3;
      local_120 = local_120 - 1;
      uVar31 = uVar32 - 1;
      if (local_120 <= uVar32 - 1) {
        uVar31 = local_120;
      }
      if (4 < *(int *)(literal_context_lut + 4)) {
        uVar31 = 0;
      }
      uVar21 = uVar29 + 1;
      uVar13 = uVar10;
      if (uVar21 < uVar10) {
        uVar13 = uVar21;
      }
      uVar35 = uVar21 & ringbuffer_mask;
      uVar27 = ringbuffer[uVar31 + uVar35];
      uVar14 = uVar21 - uVar12;
      local_118 = 0x7e4;
      if ((uVar14 < uVar21) && (uVar8 = (uint)uVar14 & uVar24, uVar27 == ringbuffer[uVar31 + uVar8])
         ) {
        uVar14 = 0;
        lVar34 = 0;
LAB_0011b94a:
        if (uVar30 == uVar14) {
          uVar14 = uVar26;
          for (local_f0 = -lVar34;
              (bVar36 = uVar14 != 0, uVar14 = uVar14 - 1, bVar36 &&
              (ringbuffer[local_f0 + uVar8] == ringbuffer[local_f0 + uVar35]));
              local_f0 = local_f0 + 1) {
          }
        }
        else {
          if (*(ulong *)(ringbuffer + uVar14 * 8 + uVar35) ==
              *(ulong *)(ringbuffer + uVar14 * 8 + (ulong)uVar8)) goto code_r0x0011b962;
          uVar22 = *(ulong *)(ringbuffer + uVar14 * 8 + (ulong)uVar8) ^
                   *(ulong *)(ringbuffer + uVar14 * 8 + uVar35);
          uVar14 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
            }
          }
          local_f0 = (uVar14 >> 3 & 0x1fffffff) - lVar34;
        }
        if ((local_f0 < 4) || (uVar14 = local_f0 * 0x87 + 0x78f, uVar14 < 0x7e5)) goto LAB_0011b9b6;
        uVar27 = ringbuffer[local_f0 + uVar35];
        uVar31 = local_f0;
        local_128 = uVar12;
        local_118 = uVar14;
      }
      else {
LAB_0011b9b6:
        local_128 = 0;
        local_f0 = 0;
      }
      lVar34 = *(long *)(ringbuffer + uVar35);
      for (lVar20 = 0; lVar20 != 0x20; lVar20 = lVar20 + 8) {
        *(ulong *)((long)auStack_58 + lVar20) =
             (ulong)((uint)((ulong)(lVar34 * 0x35a7bd1e35a7bd00) >> 0x2c) + (int)lVar20 & 0xfffff);
      }
      uVar8 = (uint)uVar21;
      for (lVar34 = 0; lVar34 != 4; lVar34 = lVar34 + 1) {
        uVar9 = *(uint *)(lVar11 + auStack_58[lVar34] * 4);
        uVar7 = uVar24 & uVar9;
        if (((uVar27 == ringbuffer[uVar31 + uVar7]) && (uVar21 != uVar9)) &&
           (uVar14 = uVar21 - uVar9, uVar14 <= uVar13)) {
          uVar22 = 0;
          lVar20 = 0;
LAB_0011ba52:
          if (uVar30 == uVar22) {
            uVar23 = uVar26;
            for (uVar22 = -lVar20;
                (bVar36 = uVar23 != 0, uVar23 = uVar23 - 1, bVar36 &&
                (ringbuffer[uVar22 + uVar7] == ringbuffer[uVar22 + uVar35])); uVar22 = uVar22 + 1) {
            }
          }
          else {
            if (*(ulong *)(ringbuffer + uVar22 * 8 + uVar35) ==
                *(ulong *)(ringbuffer + uVar22 * 8 + (ulong)uVar7)) goto code_r0x0011ba66;
            uVar23 = *(ulong *)(ringbuffer + uVar22 * 8 + (ulong)uVar7) ^
                     *(ulong *)(ringbuffer + uVar22 * 8 + uVar35);
            uVar22 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
              }
            }
            uVar22 = (uVar22 >> 3 & 0x1fffffff) - lVar20;
          }
          if (3 < uVar22) {
            iVar25 = 0x1f;
            if ((uint)uVar14 != 0) {
              for (; (uint)uVar14 >> iVar25 == 0; iVar25 = iVar25 + -1) {
              }
            }
            uVar23 = (ulong)(iVar25 * -0x1e + 0x780) + uVar22 * 0x87;
            if (local_118 < uVar23) {
              uVar27 = ringbuffer[uVar22 + uVar35];
              uVar31 = uVar22;
              local_128 = uVar14;
              local_118 = uVar23;
              local_f0 = uVar22;
            }
          }
        }
      }
      *(uint *)(lVar11 + *(long *)((long)auStack_58 + (ulong)(uVar8 & 0x18)) * 4) = uVar8;
      if (0x1f < local_120 && (uVar21 & 3) == 0) {
        for (sVar33 = (params->dist).max_distance; sVar33 <= uVar21; sVar33 = sVar33 + 4) {
          uVar9 = (params->dist).distance_postfix_bits;
          uVar7 = uVar9 & 0x3fffffff;
          (params->dist).distance_postfix_bits =
               uVar9 * *(int *)((long)&(params->dictionary).words + 4) +
               (uint)ringbuffer[sVar33 + 0x20 & ringbuffer_mask] +
               ~(uint)ringbuffer[sVar33 & ringbuffer_mask] * (params->dictionary).num_transforms + 1
          ;
          if (uVar7 < 0x1000000) {
            lVar34 = *(long *)&(params->dist).alphabet_size_max;
            uVar9 = *(uint *)(lVar34 + (ulong)uVar7 * 4);
            *(int *)(lVar34 + (ulong)uVar7 * 4) = (int)sVar33;
            if ((sVar33 == uVar21) && (uVar9 != 0xffffffff)) {
              uVar7 = uVar8 - uVar9;
              if (uVar7 <= uVar13) {
                uVar31 = 0;
                lVar34 = 0;
LAB_0011bbba:
                if (uVar30 == uVar31) {
                  uVar14 = uVar26;
                  for (uVar31 = -lVar34;
                      (bVar36 = uVar14 != 0, uVar14 = uVar14 - 1, bVar36 &&
                      (ringbuffer[uVar31 + (uVar9 & uVar24)] == ringbuffer[uVar31 + uVar35]));
                      uVar31 = uVar31 + 1) {
                  }
                }
                else {
                  if (*(ulong *)(ringbuffer + uVar31 * 8 + uVar35) ==
                      *(ulong *)(ringbuffer + uVar31 * 8 + (ulong)(uVar9 & uVar24)))
                  goto code_r0x0011bbce;
                  uVar14 = *(ulong *)(ringbuffer + uVar31 * 8 + (ulong)(uVar9 & uVar24)) ^
                           *(ulong *)(ringbuffer + uVar31 * 8 + uVar35);
                  uVar31 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  uVar31 = (uVar31 >> 3 & 0x1fffffff) - lVar34;
                }
                if ((3 < uVar31) && (local_f0 < uVar31)) {
                  iVar25 = 0x1f;
                  if (uVar7 != 0) {
                    for (; uVar7 >> iVar25 == 0; iVar25 = iVar25 + -1) {
                    }
                  }
                  uVar14 = (ulong)(iVar25 * -0x1e + 0x780) + uVar31 * 0x87;
                  if (local_118 < uVar14) {
                    local_f0 = uVar31;
                    local_128 = (ulong)uVar7;
                    local_118 = uVar14;
                  }
                }
              }
            }
          }
        }
        (params->dist).max_distance = uVar29 + 5;
      }
      uVar31 = uVar29;
      uVar30 = local_130;
      if ((local_118 < local_138 + 0xaf) ||
         (local_100 = local_128, uVar31 = uVar21, uVar32 = local_f0, uVar30 = uVar15, local_d4 == 3)
         ) break;
      local_130 = local_130 + 1;
      local_d4 = local_d4 + 1;
      uVar26 = uVar29 + 9;
      uVar19 = uVar19 - 1;
      local_138 = local_118;
      uVar29 = uVar21;
      uVar30 = local_130;
    } while (uVar26 < uVar1);
    local_130 = uVar30;
    uVar15 = lVar4 + uVar31;
    if (uVar10 <= lVar4 + uVar31) {
      uVar15 = uVar10;
    }
    if (uVar15 < local_100) {
LAB_0011bcfe:
      uVar12 = local_100 + 0xf;
LAB_0011bd02:
      if ((local_100 <= uVar15) && (uVar12 != 0)) {
        *(int *)((long)&(hasher->common).dict_num_lookups + 4) =
             (int)(hasher->common).dict_num_lookups;
        *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
        *(int *)&(hasher->common).extra = (int)local_100;
      }
    }
    else {
      uVar29 = (ulong)*(int *)&(hasher->common).extra;
      if (local_100 != uVar29) {
        uVar19 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
        uVar12 = 1;
        if (local_100 != uVar19) {
          uVar29 = (local_100 + 3) - uVar29;
          if (uVar29 < 7) {
            bVar16 = (byte)((int)uVar29 << 2);
            uVar8 = 0x9750468;
          }
          else {
            uVar19 = (local_100 + 3) - uVar19;
            if (6 < uVar19) {
              uVar12 = 2;
              if ((local_100 != (long)(int)(hasher->common).dict_num_lookups) &&
                 (uVar12 = 3,
                 local_100 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)))
              goto LAB_0011bcfe;
              goto LAB_0011bd02;
            }
            bVar16 = (byte)((int)uVar19 << 2);
            uVar8 = 0xfdb1ace;
          }
          uVar12 = (ulong)(uVar8 >> (bVar16 & 0x1f) & 0xf);
        }
        goto LAB_0011bd02;
      }
      uVar12 = 0;
    }
    uVar8 = (uint)local_130;
    *(uint *)local_f8 = uVar8;
    uVar7 = (uint)uVar32;
    *(uint *)((long)local_f8 + 4) = uVar7;
    uVar15 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
    uVar9 = 0;
    if (uVar15 <= uVar12) {
      bVar16 = (byte)*(uint *)(literal_context_lut + 0x40);
      uVar29 = ((4L << (bVar16 & 0x3f)) + (uVar12 - *(uint *)(literal_context_lut + 0x44))) - 0x10;
      uVar9 = 0x1f;
      uVar28 = (uint)uVar29;
      if (uVar28 != 0) {
        for (; uVar28 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = (uVar9 ^ 0xffffffe0) + 0x1f;
      uVar19 = (ulong)((uVar29 >> ((ulong)uVar9 & 0x3f) & 1) != 0);
      lVar34 = (ulong)uVar9 - (ulong)*(uint *)(literal_context_lut + 0x40);
      uVar12 = (~(-1 << (bVar16 & 0x1f)) & uVar28) + uVar15 +
               (uVar19 + lVar34 * 2 + 0xfffe << (bVar16 & 0x3f)) | lVar34 * 0x400;
      uVar9 = (uint)(uVar29 - (uVar19 + 2 << ((byte)uVar9 & 0x3f)) >> (bVar16 & 0x3f));
    }
    *(short *)((long)local_f8 + 0xe) = (short)uVar12;
    *(uint *)(local_f8 + 1) = uVar9;
    if (5 < local_130) {
      if (local_130 < 0x82) {
        uVar8 = 0x1f;
        uVar9 = (uint)(local_130 - 2);
        if (uVar9 != 0) {
          for (; uVar9 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar8 = (int)(local_130 - 2 >> ((char)(uVar8 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                (uVar8 ^ 0xffffffe0) * 2 + 0x40;
      }
      else if (local_130 < 0x842) {
        uVar9 = 0x1f;
        if (uVar8 - 0x42 != 0) {
          for (; uVar8 - 0x42 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        uVar8 = (uVar9 ^ 0xffe0) + 0x2a;
      }
      else {
        uVar8 = 0x15;
        if (0x1841 < local_130) {
          uVar8 = (uint)(ushort)(0x17 - (local_130 < 0x5842));
        }
      }
    }
    uVar15 = (ulong)(int)uVar7;
    if (uVar15 < 10) {
      uVar9 = uVar7 - 2;
    }
    else if (uVar15 < 0x86) {
      uVar9 = 0x1f;
      uVar7 = (uint)(uVar15 - 6);
      if (uVar7 != 0) {
        for (; uVar7 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = (int)(uVar15 - 6 >> ((char)(uVar9 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
              (uVar9 ^ 0xffffffe0) * 2 + 0x42;
    }
    else {
      uVar9 = 0x17;
      if (uVar15 < 0x846) {
        uVar9 = 0x1f;
        if (uVar7 - 0x46 != 0) {
          for (; uVar7 - 0x46 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        uVar9 = (uVar9 ^ 0xffe0) + 0x2c;
      }
    }
    uVar5 = (ushort)uVar9;
    sVar6 = (uVar5 & 7) + ((ushort)uVar8 & 7) * 8;
    if ((((uVar12 & 0x3ff) == 0) && ((ushort)uVar8 < 8)) && (uVar5 < 0x10)) {
      if (7 < uVar5) {
        sVar6 = sVar6 + 0x40;
      }
    }
    else {
      iVar25 = ((uVar8 & 0xffff) >> 3) * 3 + ((uVar9 & 0xffff) >> 3);
      sVar6 = sVar6 + ((ushort)(0x520d40 >> ((char)iVar25 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar25 * 0x40 + 0x40;
    }
    *(short *)((long)local_f8 + 0xc) = sVar6;
    *num_commands = *num_commands + local_130;
    position = uVar31 + uVar32;
    uVar29 = sVar17;
    if (position < sVar17) {
      uVar29 = position;
    }
    uVar12 = uVar31 + 2;
    if (local_100 < uVar32 >> 2) {
      uVar15 = position + local_100 * -4;
      if (uVar15 < uVar12) {
        uVar15 = uVar12;
      }
      uVar12 = uVar15;
      if (uVar29 < uVar15) {
        uVar12 = uVar29;
      }
    }
    uVar15 = uVar31 + lVar18 + uVar32 * 2;
    local_f8 = local_f8 + 2;
    for (; uVar12 < uVar29; uVar12 = uVar12 + 1) {
      *(uint *)(lVar11 + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (uVar12 & ringbuffer_mask)) *
                                               0x35a7bd1e35a7bd00) >> 0x2c) + ((uint)uVar12 & 0x18)
                                & 0xfffff) * 4) = (uint)uVar12;
    }
    local_130 = 0;
  } while( true );
  lVar11 = lVar11 + -8;
  uVar32 = uVar32 + 1;
  goto LAB_0011b47c;
code_r0x0011b57f:
  lVar20 = lVar20 + -8;
  uVar26 = uVar26 + 1;
  goto LAB_0011b56c;
code_r0x0011b6b5:
  lVar34 = lVar34 + -8;
  uVar30 = uVar30 + 1;
  goto LAB_0011b6a2;
code_r0x0011b962:
  lVar34 = lVar34 + -8;
  uVar14 = uVar14 + 1;
  goto LAB_0011b94a;
code_r0x0011ba66:
  lVar20 = lVar20 + -8;
  uVar22 = uVar22 + 1;
  goto LAB_0011ba52;
code_r0x0011bbce:
  lVar34 = lVar34 + -8;
  uVar31 = uVar31 + 1;
  goto LAB_0011bbba;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}